

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O0

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++:971:17)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_xthread_test_c__:971:17)>
             *this)

{
  Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_xthread_test_c__:971:17)>
  *this_local;
  
  NoInfer_<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++:971:17)>
  ::Type::operator()(&this->f);
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }